

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O2

void __thiscall
duckdb::ArgMinMaxBase<duckdb::LessThan,false>::
Execute<duckdb::date_t,duckdb::hugeint_t,duckdb::ArgMinMaxState<duckdb::date_t,duckdb::hugeint_t>>
          (ArgMinMaxBase<duckdb::LessThan,false> *this,
          ArgMinMaxState<duckdb::date_t,_duckdb::hugeint_t> *state,date_t x_data,hugeint_t y_data,
          AggregateBinaryInput *binary)

{
  bool bVar1;
  uint64_t uVar2;
  undefined4 in_register_00000014;
  long lVar3;
  
  lVar3 = y_data.upper;
  uVar2 = y_data.lower;
  bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                    (*(TemplatedValidityMask<unsigned_long> **)(lVar3 + 0x10),
                     *(idx_t *)(lVar3 + 0x20));
  if (bVar1) {
    if (((long)uVar2 < (long)*(uint64_t *)(this + 0x10)) ||
       (CONCAT44(in_register_00000014,x_data.days) < *(ulong *)(this + 8) &&
        *(uint64_t *)(this + 0x10) == uVar2)) {
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (*(TemplatedValidityMask<unsigned_long> **)(lVar3 + 8),
                         *(idx_t *)(lVar3 + 0x18));
      this[1] = (ArgMinMaxBase<duckdb::LessThan,false>)!bVar1;
      if (bVar1) {
        *(int *)(this + 4) = (int)state;
      }
      *(ulong *)(this + 8) = CONCAT44(in_register_00000014,x_data.days);
      *(uint64_t *)(this + 0x10) = uVar2;
    }
  }
  return;
}

Assistant:

static void Execute(STATE &state, A_TYPE x_data, B_TYPE y_data, AggregateBinaryInput &binary) {
		if ((IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) && COMPARATOR::Operation(y_data, state.value)) {
			Assign(state, x_data, y_data, !binary.left_mask.RowIsValid(binary.lidx));
		}
	}